

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicVector.hpp
# Opt level: O2

DynamicVector<double,_std::allocator<double>_> *
OpenMD::operator*(DynamicVector<double,_std::allocator<double>_> *__return_storage_ptr__,double s,
                 DynamicVector<double,_std::allocator<double>_> *v1)

{
  allocator_type local_19;
  double local_18;
  
  local_18 = s;
  std::vector<double,_std::allocator<double>_>::vector
            (&__return_storage_ptr__->data_,
             (long)(v1->data_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(v1->data_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start >> 3,&local_19);
  DynamicVector<double,_std::allocator<double>_>::mul(__return_storage_ptr__,v1,local_18);
  return __return_storage_ptr__;
}

Assistant:

DynamicVector<Real> operator*(Real s, const DynamicVector<Real>& v1) {
    DynamicVector<Real> result(v1.size());
    result.mul(v1, s);
    return result;
  }